

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall fasttext::FastText::getNN(FastText *this,string *word,int32_t k)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  type this_00;
  undefined4 in_ECX;
  string *in_RDX;
  FastText *in_RDI;
  Vector query;
  unique_ptr<fasttext::Matrix,_std::default_delete<fasttext::Matrix>_> *in_stack_fffffffffffffed0;
  int64_t in_stack_fffffffffffffef8;
  FastText *in_stack_ffffffffffffff00;
  string *psVar2;
  string *local_f8;
  allocator_type *__a;
  undefined4 in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  FastText *this_01;
  allocator_type local_b2 [2];
  string *local_b0;
  string local_a8 [32];
  string *local_88;
  undefined8 local_80;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb8;
  int32_t in_stack_ffffffffffffffc4;
  Vector *in_stack_ffffffffffffffc8;
  Matrix *in_stack_ffffffffffffffd0;
  FastText *in_stack_ffffffffffffffd8;
  
  this_01 = in_RDI;
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1776c5);
  Vector::Vector((Vector *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  getWordVector(this_01,(Vector *)in_RDI,in_stack_ffffffffffffff20);
  lazyComputeWordVectors(in_stack_ffffffffffffff00);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<fasttext::Matrix,_std::default_delete<fasttext::Matrix>_> *)
                     0x177711);
  if (!bVar1) {
    __assert_fail("wordVectors_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/fasttext.cc"
                  ,0x221,
                  "std::vector<std::pair<real, std::string>> fasttext::FastText::getNN(const std::string &, int32_t)"
                 );
  }
  this_00 = std::unique_ptr<fasttext::Matrix,_std::default_delete<fasttext::Matrix>_>::operator*
                      (in_stack_fffffffffffffed0);
  local_b0 = local_a8;
  std::__cxx11::string::string(local_b0,in_RDX);
  local_88 = local_a8;
  local_80 = 1;
  __a = local_b2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x1777c1);
  __l._M_len = (size_type)this_01;
  __l._M_array = (iterator)in_RDI;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)this_00,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        CONCAT44(in_ECX,in_stack_ffffffffffffff18),__a);
  getNN(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
        in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x177825);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x177832);
  psVar2 = local_a8;
  local_f8 = (string *)&local_88;
  do {
    local_f8 = local_f8 + -0x20;
    std::__cxx11::string::~string(local_f8);
  } while (local_f8 != psVar2);
  Vector::~Vector((Vector *)0x17787c);
  return (vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)this_01;
}

Assistant:

std::vector<std::pair<real, std::string>> FastText::getNN(
		const std::string& word,
		int32_t k) {
	Vector query(args_->dim);

	getWordVector(query, word);

	lazyComputeWordVectors();
	assert(wordVectors_);
	return getNN(*wordVectors_, query, k, {word});
}